

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

void nni_pipe_remove(nni_pipe *p)

{
  nni_sock *pnVar1;
  nni_dialer *d_00;
  nni_dialer *d;
  nni_sock *s;
  nni_pipe *p_local;
  
  pnVar1 = p->p_sock;
  d_00 = p->p_dialer;
  nni_mtx_lock(&pnVar1->s_mx);
  nni_stat_dec(&pnVar1->st_pipes,1);
  if (p->p_listener != (nni_listener *)0x0) {
    nni_stat_dec(&p->p_listener->st_pipes,1);
  }
  if (p->p_dialer != (nni_dialer *)0x0) {
    nni_stat_dec(&p->p_dialer->st_pipes,1);
  }
  nni_list_node_remove(&p->p_sock_node);
  nni_list_node_remove(&p->p_ep_node);
  if ((d_00 != (nni_dialer *)0x0) && (d_00->d_pipe == p)) {
    d_00->d_pipe = (nni_pipe *)0x0;
    dialer_timer_start_locked(d_00);
  }
  nni_cv_wake(&pnVar1->s_cv);
  nni_mtx_unlock(&pnVar1->s_mx);
  return;
}

Assistant:

void
nni_pipe_remove(nni_pipe *p)
{
	nni_sock   *s = p->p_sock;
	nni_dialer *d = p->p_dialer;

	nni_mtx_lock(&s->s_mx);
#ifdef NNG_ENABLE_STATS
	nni_stat_dec(&s->st_pipes, 1);
	if (p->p_listener != NULL) {
		nni_stat_dec(&p->p_listener->st_pipes, 1);
	}
	if (p->p_dialer != NULL) {
		nni_stat_dec(&p->p_dialer->st_pipes, 1);
	}
#endif
	nni_list_node_remove(&p->p_sock_node);
	nni_list_node_remove(&p->p_ep_node);
	if ((d != NULL) && (d->d_pipe == p)) {
		d->d_pipe = NULL;
		dialer_timer_start_locked(d); // Kick the timer to redial.
	}
	nni_cv_wake(&s->s_cv);
	nni_mtx_unlock(&s->s_mx);
}